

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O3

int testscanf(char *s,char *format,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  _PDCLIB_status_t local_120;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_120.arg[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_120.n = 0;
  local_120.i = 0;
  local_120.stream = (_PDCLIB_file_t *)0x0;
  local_120.arg[0].gp_offset = 0x10;
  local_120.arg[0].fp_offset = 0x30;
  local_120.arg[0].overflow_arg_area = &stack0x00000008;
  local_120.s = s;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  pcVar1 = _PDCLIB_scan(format,&local_120);
  if (pcVar1 == (char *)0x0) {
    if (*s == '\0') goto LAB_001039e1;
    pcVar1 = "_PDCLIB_scan() returned NULL on \'%s\' input.";
    format = s;
  }
  else {
    if (*pcVar1 == '\0') goto LAB_001039e1;
    pcVar1 = "_PDCLIB_scan() did not return end-of-specifier on \'%s\'.\n";
  }
  printf(pcVar1,format);
  TEST_RESULTS = TEST_RESULTS + 1;
LAB_001039e1:
  return (int)local_120.n;
}

Assistant:

static int testscanf( const char * s, const char * format, ... )
{
    struct _PDCLIB_status_t status;
    char const * rc;

    status.n = 0;
    status.i = 0;
    status.s = ( char * )s;
    status.stream = NULL;
    va_start( status.arg, format );

    rc = _PDCLIB_scan( format, &status );

    if ( rc != NULL && rc[0] != '\0' )
    {
        printf( "_PDCLIB_scan() did not return end-of-specifier on '%s'.\n", format );
        ++TEST_RESULTS;
    }

    if ( rc == NULL && s[0] != '\0' )
    {
        printf( "_PDCLIB_scan() returned NULL on '%s' input.", s );
        ++TEST_RESULTS;
    }

    va_end( status.arg );
    return status.n;
}